

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

BindingFrame * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::capture
          (Interpreter *this,
          vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
          *free_vars)

{
  bool bVar1;
  reference ppIVar2;
  undefined8 in_RDX;
  Identifier *in_RSI;
  BindingFrame *in_RDI;
  HeapThunk *th;
  Identifier *fv;
  const_iterator __end3;
  const_iterator __begin3;
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  *__range3;
  BindingFrame *env;
  HeapThunk *in_stack_ffffffffffffff78;
  __normal_iterator<const_jsonnet::internal::Identifier_*const_*,_std::vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>_>
  *in_stack_ffffffffffffff80;
  Stack *in_stack_ffffffffffffffa8;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  *this_00;
  __normal_iterator<const_jsonnet::internal::Identifier_*const_*,_std::vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>_>
  local_30;
  undefined8 local_28;
  undefined1 local_19;
  undefined8 local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  std::
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  ::map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
         *)0x249c8a);
  local_28 = local_18;
  local_30._M_current =
       (Identifier **)
       std::
       vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
       ::begin((vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                *)in_stack_ffffffffffffff78);
  std::
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::end((vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
         *)in_stack_ffffffffffffff78);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff80,
                            (__normal_iterator<const_jsonnet::internal::Identifier_*const_*,_std::vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>_>
                             *)in_stack_ffffffffffffff78), bVar1) {
    ppIVar2 = __gnu_cxx::
              __normal_iterator<const_jsonnet::internal::Identifier_*const_*,_std::vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>_>
              ::operator*(&local_30);
    this_00 = (map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
               *)*ppIVar2;
    in_stack_ffffffffffffff78 = Stack::lookUpVar(in_stack_ffffffffffffffa8,in_RSI);
    in_stack_ffffffffffffff80 =
         (__normal_iterator<const_jsonnet::internal::Identifier_*const_*,_std::vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>_>
          *)std::
            map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
            ::operator[](this_00,(key_type *)in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff80->_M_current = (Identifier **)in_stack_ffffffffffffff78;
    __gnu_cxx::
    __normal_iterator<const_jsonnet::internal::Identifier_*const_*,_std::vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>_>
    ::operator++(&local_30);
  }
  return in_RDI;
}

Assistant:

BindingFrame capture(const std::vector<const Identifier *> &free_vars)
    {
        BindingFrame env;
        for (auto fv : free_vars) {
            auto *th = stack.lookUpVar(fv);
            env[fv] = th;
        }
        return env;
    }